

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_sse2.c
# Opt level: O2

void aom_highbd_quantize_b_64x64_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  short sVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int local_1078 [4];
  int local_1068;
  int iStack_1064;
  int iStack_1060;
  int iStack_105c;
  __m128i zbins [2];
  int idx_arr [1024];
  
  auVar20 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  zbins[0][0]._0_4_ = (auVar20._0_4_ >> 0x10) + 2 >> 2;
  zbins[0][0]._4_4_ = (auVar20._4_4_ >> 0x10) + 2 >> 2;
  local_1078[0] = -(int)zbins[0][0];
  local_1078[1] = -zbins[0][0]._4_4_;
  local_1078[2] = -zbins[0][0]._4_4_;
  local_1078[3] = -zbins[0][0]._4_4_;
  local_1068 = -zbins[0][0]._4_4_;
  iStack_1064 = -zbins[0][0]._4_4_;
  iStack_1060 = -zbins[0][0]._4_4_;
  iStack_105c = -zbins[0][0]._4_4_;
  lVar13 = 0;
  zbins[0][1]._0_4_ = zbins[0][0]._4_4_;
  zbins[0][1]._4_4_ = zbins[0][0]._4_4_;
  zbins[1][0]._0_4_ = zbins[0][0]._4_4_;
  zbins[1][0]._4_4_ = zbins[0][0]._4_4_;
  zbins[1][1]._0_4_ = zbins[0][0]._4_4_;
  zbins[1][1]._4_4_ = zbins[0][0]._4_4_;
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  lVar17 = n_coeffs / 4;
  if (n_coeffs / 4 < 1) {
    lVar17 = lVar13;
  }
  uVar11 = 0;
  for (; lVar17 * 4 != lVar13; lVar13 = lVar13 + 4) {
    piVar1 = coeff_ptr + lVar13;
    uVar12 = (ulong)(lVar13 != 0);
    auVar21._0_4_ = -(uint)(*piVar1 < (int)zbins[uVar12][0]);
    auVar21._4_4_ = -(uint)(piVar1[1] < *(int *)((long)zbins[uVar12] + 4));
    auVar21._8_4_ = -(uint)(piVar1[2] < (int)zbins[uVar12][1]);
    auVar21._12_4_ = -(uint)(piVar1[3] < *(int *)((long)zbins[uVar12] + 0xc));
    auVar20._0_4_ = -(uint)(local_1078[uVar12 * 4] < *piVar1);
    auVar20._4_4_ = -(uint)(local_1078[uVar12 * 4 + 1] < piVar1[1]);
    auVar20._8_4_ = -(uint)(local_1078[uVar12 * 4 + 2] < piVar1[2]);
    auVar20._12_4_ = -(uint)(local_1078[uVar12 * 4 + 3] < piVar1[3]);
    auVar20 = auVar20 & auVar21;
    uVar2 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3;
    uVar3 = (ushort)(SUB161(auVar20 >> 0x27,0) & 1);
    uVar4 = (ushort)(SUB161(auVar20 >> 0x2f,0) & 1);
    uVar5 = (ushort)(SUB161(auVar20 >> 0x37,0) & 1);
    uVar6 = (ushort)(SUB161(auVar20 >> 0x3f,0) & 1);
    uVar7 = (ushort)(SUB161(auVar20 >> 0x4f,0) & 1);
    uVar8 = (ushort)(SUB161(auVar20 >> 0x57,0) & 1);
    uVar9 = (ushort)(SUB161(auVar20 >> 0x5f,0) & 1);
    iVar19 = (int)lVar13;
    if (uVar2 == 0) {
      lVar14 = (long)(int)uVar11;
      uVar11 = uVar11 + 1;
      idx_arr[lVar14] = iVar19;
    }
    if (((uVar3 == 0 && uVar4 == 0) && uVar5 == 0) && uVar6 == 0) {
      lVar14 = (long)(int)uVar11;
      uVar11 = uVar11 + 1;
      idx_arr[lVar14] = iVar19 + 1;
    }
    if ((((auVar20 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0 && uVar7 == 0) &&
        uVar8 == 0) && uVar9 == 0) {
      lVar14 = (long)(int)uVar11;
      uVar11 = uVar11 + 1;
      idx_arr[lVar14] = iVar19 + 2;
    }
    if ((ushort)(uVar2 | uVar3 << 4 | uVar4 << 5 | uVar5 << 6 | uVar6 << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 | uVar7 << 9 | uVar8 << 10 |
                 uVar9 << 0xb | (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) < 0x1000) {
      lVar14 = (long)(int)uVar11;
      uVar11 = uVar11 + 1;
      idx_arr[lVar14] = iVar19 + 3;
    }
  }
  uVar15 = 0;
  uVar12 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar12 = uVar15;
  }
  sVar16 = -1;
  for (; uVar12 != uVar15; uVar15 = uVar15 + 1) {
    lVar17 = (long)idx_arr[uVar15];
    uVar11 = coeff_ptr[lVar17] >> 0x1f;
    uVar10 = (ulong)((uint)(lVar17 != 0) * 2);
    lVar13 = (long)(int)((*(short *)((long)round_ptr + uVar10) + 2 >> 2) +
                        ((coeff_ptr[lVar17] ^ uVar11) - uVar11));
    uVar18 = (uint)((long)*(short *)((long)quant_shift_ptr + uVar10) *
                    (((ulong)(*(short *)((long)quant_ptr + uVar10) * lVar13) >> 0x10) + lVar13) >>
                   0xe);
    iVar19 = (uVar11 ^ uVar18) - uVar11;
    qcoeff_ptr[lVar17] = iVar19;
    dqcoeff_ptr[lVar17] = (*(short *)((long)dequant_ptr + uVar10) * iVar19) / 4;
    if (uVar18 != 0) {
      if (sVar16 <= iscan[lVar17]) {
        sVar16 = iscan[lVar17];
      }
    }
  }
  *eob_ptr = sVar16 + 1;
  return;
}

Assistant:

void aom_highbd_quantize_b_64x64_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  __m128i zbins[2];
  __m128i nzbins[2];
  int idx = 0;
  int idx_arr[1024];
  int i, eob = -1;
  const int zbin0_tmp = ROUND_POWER_OF_TWO(zbin_ptr[0], 2);
  const int zbin1_tmp = ROUND_POWER_OF_TWO(zbin_ptr[1], 2);
  (void)scan;
  zbins[0] = _mm_set_epi32(zbin1_tmp, zbin1_tmp, zbin1_tmp, zbin0_tmp);
  zbins[1] = _mm_set1_epi32(zbin1_tmp);

  nzbins[0] = _mm_setzero_si128();
  nzbins[1] = _mm_setzero_si128();
  nzbins[0] = _mm_sub_epi32(nzbins[0], zbins[0]);
  nzbins[1] = _mm_sub_epi32(nzbins[1], zbins[1]);

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = 0; i < n_coeffs / 4; i++) {
    __m128i coeffs, cmp1, cmp2;
    int test;
    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    cmp1 = _mm_cmplt_epi32(coeffs, zbins[i != 0]);
    cmp2 = _mm_cmpgt_epi32(coeffs, nzbins[i != 0]);
    cmp1 = _mm_and_si128(cmp1, cmp2);
    test = _mm_movemask_epi8(cmp1);
    if (!(test & 0xf)) idx_arr[idx++] = i * 4;
    if (!(test & 0xf0)) idx_arr[idx++] = i * 4 + 1;
    if (!(test & 0xf00)) idx_arr[idx++] = i * 4 + 2;
    if (!(test & 0xf000)) idx_arr[idx++] = i * 4 + 3;
  }

  // Quantization pass: only process the coefficients selected in
  // pre-scan pass. Note: idx can be zero.
  for (i = 0; i < idx; i++) {
    const int rc = idx_arr[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    const int64_t tmp1 = abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], 2);
    const int64_t tmp2 = ((tmp1 * quant_ptr[rc != 0]) >> 16) + tmp1;
    const uint32_t abs_qcoeff =
        (uint32_t)((tmp2 * quant_shift_ptr[rc != 0]) >> 14);
    qcoeff_ptr[rc] = (int)(abs_qcoeff ^ (uint32_t)coeff_sign) - coeff_sign;
    dqcoeff_ptr[rc] = qcoeff_ptr[rc] * dequant_ptr[rc != 0] / 4;
    if (abs_qcoeff) eob = iscan[idx_arr[i]] > eob ? iscan[idx_arr[i]] : eob;
  }
  *eob_ptr = eob + 1;
}